

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

Gia_Man_t * Ifn_ManStrFindModel(Ifn_Ntk_t *p)

{
  int iVar1;
  uint uVar2;
  void *__s;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Man_t *pGVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  int *piVar10;
  size_t __size;
  long lVar11;
  int pVarsData [256];
  ulong uVar9;
  
  __size = (long)p->nParsVIni << 2;
  __s = malloc(__size);
  memset(__s,0xff,__size);
  p_00 = Gia_ManStart(1000);
  pcVar3 = Abc_UtilStrsav("model");
  p_00->pName = pcVar3;
  Gia_ManHashStart(p_00);
  for (lVar7 = 0; lVar7 < p->nInps; lVar7 = lVar7 + 1) {
    iVar1 = Gia_ManAppendCi(p_00);
    *(int *)((long)__s + lVar7 * 4) = iVar1;
  }
  for (lVar7 = (long)p->nObjs; lVar7 < p->nParsVIni; lVar7 = lVar7 + 1) {
    iVar1 = Gia_ManAppendCi(p_00);
    *(int *)((long)__s + lVar7 * 4) = iVar1;
  }
  lVar7 = (long)p->nInps;
  piVar10 = p->Nodes[lVar7].Fanins;
  do {
    if (p->nObjs <= lVar7) {
      Gia_ManAppendCo(p_00,*(int *)((long)__s + (long)p->nObjs * 4 + -4));
      free(__s);
      pGVar4 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      if (pGVar4->vCis->nSize - pGVar4->nRegs != (p->nParsVIni - p->nObjs) + p->nInps) {
        __assert_fail("Gia_ManPiNum(pNew) == p->nParsVIni - (p->nObjs - p->nInps)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                      ,0x21f,"Gia_Man_t *Ifn_ManStrFindModel(Ifn_Ntk_t *)");
      }
      if (pGVar4->vCos->nSize - pGVar4->nRegs == 1) {
        return pGVar4;
      }
      __assert_fail("Gia_ManPoNum(pNew) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                    ,0x220,"Gia_Man_t *Ifn_ManStrFindModel(Ifn_Ntk_t *)");
    }
    uVar2 = *(uint *)(p->Nodes + lVar7);
    if (3 < (uVar2 & 7) - 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                    ,0x219,"Gia_Man_t *Ifn_ManStrFindModel(Ifn_Ntk_t *)");
    }
    uVar8 = uVar2 >> 3 & 0x1f;
    uVar9 = (ulong)uVar8;
    switch(uVar2 & 7) {
    case 3:
      iVar1 = 1;
      for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
        iVar1 = Gia_ManHashAnd(p_00,iVar1,*(int *)((long)__s + (long)piVar10[uVar5] * 4));
      }
      goto LAB_003329b3;
    case 4:
      iVar1 = 0;
      for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
        iVar1 = Gia_ManHashXor(p_00,iVar1,*(int *)((long)__s + (long)piVar10[uVar5] * 4));
      }
LAB_003329b3:
      *(int *)((long)__s + lVar7 * 4) = iVar1;
      break;
    case 5:
      if (uVar8 != 3) {
        __assert_fail("nFans == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                      ,0x209,"Gia_Man_t *Ifn_ManStrFindModel(Ifn_Ntk_t *)");
      }
      iVar1 = Gia_ManHashMux(p_00,*(int *)((long)__s + (long)p->Nodes[lVar7].Fanins[0] * 4),
                             *(int *)((long)__s + (long)p->Nodes[lVar7].Fanins[1] * 4),
                             *(int *)((long)__s + (long)p->Nodes[lVar7].Fanins[2] * 4));
      *(int *)((long)__s + lVar7 * 4) = iVar1;
      break;
    case 6:
      uVar6 = 1 << (sbyte)uVar8;
      if (8 < uVar8) {
        __assert_fail("nFans >= 0 && nFans <= 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                      ,0x210,"Gia_Man_t *Ifn_ManStrFindModel(Ifn_Ntk_t *)");
      }
      for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        pVarsData[uVar5] = *(int *)((long)__s + uVar5 * 4 + (ulong)(uVar2 >> 8 & 0xff) * 4);
      }
      uVar2 = 1;
      for (uVar5 = 0; uVar5 != uVar9; uVar5 = uVar5 + 1) {
        for (lVar11 = 0; lVar11 < (long)(ulong)uVar6; lVar11 = lVar11 + (int)(uVar2 * 2)) {
          iVar1 = Gia_ManHashMux(p_00,*(int *)((long)__s + (long)p->Nodes[lVar7].Fanins[uVar5] * 4),
                                 pVarsData[(int)uVar2 + lVar11],pVarsData[lVar11]);
          pVarsData[lVar11] = iVar1;
        }
        uVar2 = uVar2 * 2;
      }
      if (uVar2 != uVar6) {
        __assert_fail("Step == nMints",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                      ,0x216,"Gia_Man_t *Ifn_ManStrFindModel(Ifn_Ntk_t *)");
      }
      *(int *)((long)__s + lVar7 * 4) = pVarsData[0];
    }
    lVar7 = lVar7 + 1;
    piVar10 = piVar10 + 0xc;
  } while( true );
}

Assistant:

Gia_Man_t * Ifn_ManStrFindModel( Ifn_Ntk_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    int i, k, iLit, * pVarMap = ABC_FALLOC( int, p->nParsVIni );
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "model" );
    Gia_ManHashStart( pNew );
    for ( i = 0; i < p->nInps; i++ )
        pVarMap[i] = Gia_ManAppendCi(pNew);
    for ( i = p->nObjs; i < p->nParsVIni; i++ )
        pVarMap[i] = Gia_ManAppendCi(pNew);
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        int Type = p->Nodes[i].Type;
        int nFans = p->Nodes[i].nFanins;
        int * pFans = p->Nodes[i].Fanins;
        int iFanin = p->Nodes[i].iFirst;
        if ( Type == IFN_DSD_AND )
        {
            iLit = 1;
            for ( k = 0; k < nFans; k++ )
                iLit = Gia_ManHashAnd( pNew, iLit, pVarMap[pFans[k]] );
            pVarMap[i] = iLit;
        }
        else if ( Type == IFN_DSD_XOR )
        {
            iLit = 0;
            for ( k = 0; k < nFans; k++ )
                iLit = Gia_ManHashXor( pNew, iLit, pVarMap[pFans[k]] );
            pVarMap[i] = iLit;
        }
        else if ( Type == IFN_DSD_MUX )
        {
            assert( nFans == 3 );
            pVarMap[i] = Gia_ManHashMux( pNew, pVarMap[pFans[0]], pVarMap[pFans[1]], pVarMap[pFans[2]] );
        }
        else if ( Type == IFN_DSD_PRIME )
        {
            int n, Step, pVarsData[256];
            int nMints = (1 << nFans);
            assert( nFans >= 0 && nFans <= 8 );
            for ( k = 0; k < nMints; k++ )
                pVarsData[k] = pVarMap[iFanin + k];
            for ( Step = 1, k = 0; k < nFans; k++, Step <<= 1 )
                for ( n = 0; n < nMints; n += Step << 1 )
                    pVarsData[n] = Gia_ManHashMux( pNew, pVarMap[pFans[k]], pVarsData[n+Step], pVarsData[n] );
            assert( Step == nMints );
            pVarMap[i] = pVarsData[0];
        }
        else assert( 0 );
    }
    Gia_ManAppendCo( pNew, pVarMap[p->nObjs-1] );
    ABC_FREE( pVarMap );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == p->nParsVIni - (p->nObjs - p->nInps) );
    assert( Gia_ManPoNum(pNew) == 1 );
    return pNew;
}